

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 sqlite3BtreeOffset(BtCursor *pCur)

{
  long in_RDI;
  
  getCellInfo((BtCursor *)0x18e85e);
  return (ulong)*(uint *)(*(long *)(in_RDI + 0x20) + 0x34) *
         ((ulong)*(uint *)(*(long *)(in_RDI + 0x88) + 4) - 1) +
         (*(long *)(in_RDI + 0x38) - *(long *)(*(long *)(in_RDI + 0x88) + 0x50));
}

Assistant:

SQLITE_PRIVATE i64 sqlite3BtreeOffset(BtCursor *pCur){
  assert( cursorHoldsMutex(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  getCellInfo(pCur);
  return (i64)pCur->pBt->pageSize*((i64)pCur->pPage->pgno - 1) +
         (i64)(pCur->info.pPayload - pCur->pPage->aData);
}